

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O1

string * serialize_combined_abi_cxx11_
                   (string *__return_storage_ptr__,char *serialized_model,char *serialized_model_ext
                   ,char *serialized_imputer,char *serialized_indexer,char *optional_metadata,
                   size_t size_optional_metadata)

{
  char cVar1;
  char *pcVar2;
  char *ptr;
  pointer local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  pcVar2 = serialized_model;
  if (serialized_model == (char *)0x0) {
    pcVar2 = serialized_model_ext;
  }
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  cVar1 = (char)*(undefined8 *)(pcVar2 + 0x17) + 'A';
  if (serialized_imputer != (char *)0x0) {
    cVar1 = cVar1 + (char)*(undefined8 *)(serialized_imputer + 0x17);
  }
  if (serialized_indexer != (char *)0x0) {
    cVar1 = cVar1 + (char)*(undefined8 *)(serialized_indexer + 0x17);
  }
  std::__cxx11::string::resize
            ((ulong)__return_storage_ptr__,(char)size_optional_metadata + cVar1 + '\t');
  local_38 = (__return_storage_ptr__->_M_dataplus)._M_p;
  serialize_combined<char*>
            (serialized_model,serialized_model_ext,serialized_imputer,serialized_indexer,
             optional_metadata,size_optional_metadata,&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string serialize_combined
(
    const char *serialized_model,
    const char *serialized_model_ext,
    const char *serialized_imputer,
    const char *serialized_indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata
)
{
    std::string serialized;
    serialized.resize(
        determine_serialized_size_combined(
            serialized_model,
            serialized_model_ext,
            serialized_imputer,
            serialized_indexer,
            size_optional_metadata
        )
    );
    char *ptr = &serialized[0];
    serialize_combined(
        serialized_model,
        serialized_model_ext,
        serialized_imputer,
        serialized_indexer,
        optional_metadata,
        size_optional_metadata,
        ptr
    );
    return serialized;
}